

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O0

uint64_t __thiscall xmrig::OclSharedData::adjustDelay(OclSharedData *this,size_t id)

{
  undefined8 uVar1;
  long lVar2;
  mutex_type *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  uint64_t dt;
  lock_guard<std::mutex> lock;
  uint64_t delay;
  uint64_t t0;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  unsigned_long local_28;
  uint64_t local_20;
  mutex_type *__rtime;
  uint64_t local_8;
  undefined4 uVar7;
  
  if ((in_RDI->super___mutex_base)._M_mutex.__data.__list.__next < (__pthread_internal_list *)0x2) {
    local_8 = 0;
  }
  else {
    __rtime = in_RDI;
    local_20 = Chrono::steadyMSecs();
    local_28 = 0;
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_RDI);
    lVar2 = local_20 - *(long *)((long)&in_RDI[2].super___mutex_base._M_mutex + 8);
    *(uint64_t *)((long)&in_RDI[2].super___mutex_base._M_mutex + 8) = local_20;
    if (lVar2 != 0) {
      uVar7 = (undefined4)((ulong)lVar2 >> 0x20);
      auVar4._8_4_ = uVar7;
      auVar4._0_8_ = lVar2;
      auVar4._12_4_ = 0x45300000;
      uVar1 = *(undefined8 *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x20);
      auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar8._0_8_ = uVar1;
      auVar8._12_4_ = 0x45300000;
      if ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) <
          *(double *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) *
          (*(double *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) /
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)))) {
        uVar1 = *(undefined8 *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x20);
        auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar5._0_8_ = uVar1;
        auVar5._12_4_ = 0x45300000;
        auVar6._8_4_ = uVar7;
        auVar6._0_8_ = lVar2;
        auVar6._12_4_ = 0x45300000;
        dVar3 = *(double *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
        local_28 = (unsigned_long)dVar3;
        local_28 = local_28 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_28 >> 0x3f;
        *(undefined8 *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) = 0x3fe8000000000000;
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21902b);
    if (local_28 == 0) {
      local_8 = 0;
    }
    else {
      if (399 < local_28) {
        local_28 = 200;
      }
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
                ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffc0,&local_28);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime);
      local_8 = local_28;
    }
  }
  return local_8;
}

Assistant:

uint64_t xmrig::OclSharedData::adjustDelay(size_t id)
{
    if (m_threads < 2) {
        return 0;
    }

    const uint64_t t0 = Chrono::steadyMSecs();
    uint64_t delay    = 0;

    {
        std::lock_guard<std::mutex> lock(m_mutex);

        const uint64_t dt = t0 - m_timestamp;
        m_timestamp = t0;

        // The perfect interleaving is when N threads on the same GPU start with T/N interval between each other
        // If a thread starts earlier than 0.75*T/N ms after the previous thread, delay it to restore perfect interleaving
        if ((dt > 0) && (dt < m_threshold * (m_averageRunTime / m_threads))) {
            delay = static_cast<uint64_t>(m_averageRunTime / m_threads - dt);
            m_threshold = 0.75;
        }
    }

    if (delay == 0) {
        return 0;
    }

    if (delay >= 400) {
        delay = 200;
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(delay));

#   ifdef XMRIG_INTERLEAVE_DEBUG
    LOG_WARN("Thread #%zu was paused for %" PRIu64 " ms to adjust interleaving", id, delay);
#   endif

    return delay;
}